

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O3

logic_t __thiscall slang::SVInt::operator==(SVInt *this,SVInt *rhs)

{
  logic_t lVar1;
  bool bVar2;
  optional<unsigned_long> oVar3;
  optional<unsigned_long> oVar4;
  
  if (((((this->super_SVIntStorage).bitWidth < 0x41) &&
       (((this->super_SVIntStorage).unknownFlag & 1U) == 0)) &&
      ((rhs->super_SVIntStorage).bitWidth < 0x41)) &&
     (((rhs->super_SVIntStorage).unknownFlag & 1U) == 0)) {
    oVar3 = as<unsigned_long>(this);
    oVar4 = as<unsigned_long>(rhs);
    bVar2 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged ==
            oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged;
    if ((oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged & bVar2) == 1) {
      bVar2 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_payload ==
              oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_payload;
    }
    return (logic_t)bVar2;
  }
  lVar1 = equalsSlowCase(this,rhs);
  return (logic_t)lVar1.value;
}

Assistant:

logic_t operator==(const SVInt& rhs) const {
        if (isSingleWord() && rhs.isSingleWord())
            return logic_t(as<uint64_t>() == rhs.as<uint64_t>());
        return equalsSlowCase(rhs);
    }